

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                      ._M_head_impl,
                     &(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                      ._M_head_impl);
  if (!bVar1) {
    bVar1 = ParamIterator<libaom_test::TestMode>::operator==
                      (&(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                        ._M_head_impl,
                       &(this->end_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                        ._M_head_impl);
    if (!bVar1) {
      bVar1 = ParamIterator<int>::operator==
                        (&(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl,
                         &(this->end_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                          .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl);
      if (!bVar1) {
        bVar1 = ParamIterator<unsigned_int>::operator==
                          ((ParamIterator<unsigned_int> *)&this->current_,
                           (ParamIterator<unsigned_int> *)&this->end_);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }